

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

Window anon_unknown.dwarf_ccfdb::getParentWindow(Display *disp,Window win)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint numChildren;
  Window *children;
  Window parent;
  Window root;
  undefined1 local_2c [4];
  long local_28;
  Window local_20;
  undefined1 local_18 [24];
  
  local_28 = 0;
  XQueryTree(in_RDI,in_RSI,local_18,&local_20,&local_28,local_2c);
  if (local_28 != 0) {
    XFree(local_28);
  }
  return local_20;
}

Assistant:

::Window getParentWindow(::Display* disp, ::Window win)
    {
        ::Window root, parent;
        ::Window* children = NULL;
        unsigned int numChildren;

        XQueryTree(disp, win, &root, &parent, &children, &numChildren);

        // Children information is not used, so must be freed.
        if (children != NULL)
            XFree(children);

        return parent;
    }